

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O0

void __thiscall
QTextDocumentLayoutPrivate::drawListItem
          (QTextDocumentLayoutPrivate *this,QPointF *offset,QPainter *painter,PaintContext *context,
          QTextBlock *bl,QTextCharFormat *selectionFormat)

{
  bool bVar1;
  bool bVar2;
  Style SVar3;
  int iVar4;
  LayoutDirection aDirection;
  MarkerType MVar5;
  QTextDocumentLayout *p;
  QPaintDevice *pQVar6;
  QPointF *pos_00;
  QRectF *clip;
  qreal *pqVar7;
  QFont *font_00;
  QBrush *in_RDX;
  QTextDocumentLayoutPrivate *in_RDI;
  QTextLayout *in_R9;
  long in_FS_OFFSET;
  qreal qVar8;
  double dVar9;
  qreal ypos;
  QTextLine QVar10;
  int adj;
  bool marker;
  qreal xoff;
  LayoutDirection dir;
  QTextLayout *layout;
  int style;
  QTextObject *object;
  QTextDocumentLayout *q;
  QTextLine line;
  QTextOption option;
  QTextLayout layout_1;
  QRectF outer;
  QBrush brush;
  QBrush fg;
  QRectF r;
  QRectF textRect;
  QPointF pos;
  QTextLine firstLine;
  QSizeF size;
  QString itemText;
  QFontMetrics fontMetrics;
  QTextListFormat lf;
  QFont font;
  QTextCharFormat charFormat;
  QTextBlockFormat blockFormat;
  QRectF *in_stack_fffffffffffffb88;
  undefined1 included;
  QTextOption *in_stack_fffffffffffffb90;
  QRectF *in_stack_fffffffffffffb98;
  QRectF *in_stack_fffffffffffffba0;
  QPaintDevice *in_stack_fffffffffffffba8;
  QRectF *in_stack_fffffffffffffbb0;
  undefined4 in_stack_fffffffffffffbb8;
  PenStyle in_stack_fffffffffffffbbc;
  QBrush *in_stack_fffffffffffffbc0;
  QTextLine *in_stack_fffffffffffffbc8;
  QChar ch;
  QTextBlock *in_stack_fffffffffffffbd8;
  QBrush *in_stack_fffffffffffffc08;
  QTextBlock *in_stack_fffffffffffffc18;
  QTextList *in_stack_fffffffffffffc20;
  qreal local_390;
  undefined4 in_stack_fffffffffffffc88;
  QRectF local_300;
  undefined1 local_2e0 [24];
  QPointF local_2c8;
  undefined1 *local_2b8;
  QTextEngine *local_2b0;
  undefined1 *local_2a8;
  qreal local_2a0;
  QTextOptionPrivate *local_298;
  QTextLayout local_290;
  QColor local_288;
  QPointF local_268;
  QPointF local_258;
  QPointF local_248;
  QPointF local_238;
  QColor local_228;
  undefined8 local_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined1 *local_1e0;
  undefined4 local_1cc;
  undefined1 *local_1c8;
  QChar local_1a2;
  QRectF local_1a0;
  QPointF local_168;
  QPoint local_158;
  QPointF local_150;
  QRectF local_140;
  QPointF local_120;
  QPointF local_110;
  QPoint local_100;
  QPointF local_f8;
  undefined1 *local_e8;
  QTextEngine *local_e0;
  QSizeF local_d8;
  undefined1 *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined4 local_a0;
  undefined2 local_9c;
  undefined6 local_98;
  undefined2 local_92;
  undefined6 uStack_90;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  p = q_func(in_RDI);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QTextBlock::blockFormat((QTextBlock *)in_stack_fffffffffffffba0);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  QTextBlock::charFormat((QTextBlock *)in_stack_fffffffffffffba0);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  QTextCharFormat::font((QTextCharFormat *)in_stack_fffffffffffffb98);
  pQVar6 = QAbstractTextDocumentLayout::paintDevice
                     ((QAbstractTextDocumentLayout *)in_stack_fffffffffffffb90);
  if (pQVar6 != (QPaintDevice *)0x0) {
    QAbstractTextDocumentLayout::paintDevice
              ((QAbstractTextDocumentLayout *)in_stack_fffffffffffffb90);
    QFont::QFont((QFont *)in_stack_fffffffffffffbb0,(QFont *)in_stack_fffffffffffffba8,
                 (QPaintDevice *)in_stack_fffffffffffffba0);
    QFont::operator=((QFont *)in_stack_fffffffffffffb90,(QFont *)in_stack_fffffffffffffb88);
    QFont::~QFont((QFont *)0x800bbc);
  }
  local_b0 = &DAT_aaaaaaaaaaaaaaaa;
  QFontMetrics::QFontMetrics
            ((QFontMetrics *)in_stack_fffffffffffffb90,(QFont *)in_stack_fffffffffffffb88);
  pos_00 = (QPointF *)
           QTextDocument::objectForFormat
                     ((QTextDocument *)in_stack_fffffffffffffb90,
                      (QTextFormat *)in_stack_fffffffffffffb88);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QTextObject::format((QTextObject *)in_stack_fffffffffffffb98);
  QTextFormat::toListFormat((QTextFormat *)in_stack_fffffffffffffb88);
  QTextFormat::~QTextFormat((QTextFormat *)0x800c59);
  SVar3 = QTextListFormat::style((QTextListFormat *)0x800c66);
  local_c8 = &DAT_aaaaaaaaaaaaaaaa;
  local_c0 = &DAT_aaaaaaaaaaaaaaaa;
  local_b8 = &DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x800ca7);
  local_d8.wd = -NAN;
  local_d8.ht = -NAN;
  QSizeF::QSizeF(&local_d8);
  bVar1 = QTextFormat::hasProperty
                    ((QTextFormat *)in_stack_fffffffffffffba0,
                     (int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
  if (bVar1) {
    SVar3 = QTextFormat::intProperty
                      ((QTextFormat *)in_stack_fffffffffffffba0,
                       (int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
  }
  clip = (QRectF *)QTextBlock::layout((QTextBlock *)in_stack_fffffffffffffb98);
  iVar4 = QTextLayout::lineCount((QTextLayout *)0x800d25);
  if (iVar4 != 0) {
    local_e8 = &DAT_aaaaaaaaaaaaaaaa;
    local_e0 = (QTextEngine *)&DAT_aaaaaaaaaaaaaaaa;
    QVar10 = QTextLayout::lineAt((QTextLayout *)in_stack_fffffffffffffba8,
                                 (int)((ulong)in_stack_fffffffffffffba0 >> 0x20));
    local_e0 = QVar10.eng;
    local_e8 = (undefined1 *)CONCAT44(local_e8._4_4_,QVar10.index);
    local_f8.xp = -NAN;
    local_f8.yp = -NAN;
    local_120 = QTextLayout::position((QTextLayout *)in_stack_fffffffffffffb98);
    local_110 = ::operator+((QPointF *)in_stack_fffffffffffffb98,
                            (QPointF *)in_stack_fffffffffffffb90);
    local_100 = QPointF::toPoint((QPointF *)in_stack_fffffffffffffba0);
    QPointF::QPointF((QPointF *)in_stack_fffffffffffffb90,(QPoint *)in_stack_fffffffffffffb88);
    aDirection = QTextBlock::textDirection(in_stack_fffffffffffffbd8);
    local_140.xp = -NAN;
    local_140.yp = -NAN;
    local_140.w = -NAN;
    local_140.h = -NAN;
    QTextLine::naturalTextRect(in_stack_fffffffffffffbc8);
    ch.ucs = (char16_t)((ulong)in_stack_fffffffffffffbc8 >> 0x30);
    local_168 = QRectF::topLeft(in_stack_fffffffffffffb98);
    local_158 = QPointF::toPoint((QPointF *)in_stack_fffffffffffffba0);
    QPointF::QPointF((QPointF *)in_stack_fffffffffffffb90,(QPoint *)in_stack_fffffffffffffb88);
    QPointF::operator+=(&local_f8,&local_150);
    if (aDirection == RightToLeft) {
      qVar8 = QRectF::width(&local_140);
      pqVar7 = QPointF::rx(&local_f8);
      *pqVar7 = qVar8 + *pqVar7;
    }
    if ((uint)(SVar3 + 8) < 5) {
      QTextList::itemText(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      QString::operator=((QString *)in_stack_fffffffffffffb90,(QString *)in_stack_fffffffffffffb88);
      QString::~QString((QString *)0x800f95);
      iVar4 = QFontMetrics::horizontalAdvance
                        ((QFontMetrics *)in_stack_fffffffffffffbc0,
                         (QString *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                         (int)((ulong)in_stack_fffffffffffffbb0 >> 0x20));
      QSizeF::setWidth(&local_d8,(double)iVar4);
      iVar4 = QFontMetrics::height((QFontMetrics *)in_stack_fffffffffffffba0);
      QSizeF::setHeight(&local_d8,(double)iVar4);
    }
    else {
      if (2 < (uint)(SVar3 + ~ListDecimal)) goto LAB_00801b53;
      iVar4 = QFontMetrics::lineSpacing((QFontMetrics *)in_stack_fffffffffffffba0);
      QSizeF::setWidth(&local_d8,(double)(iVar4 / 3));
      qVar8 = QSizeF::width(&local_d8);
      QSizeF::setHeight(&local_d8,qVar8);
    }
    local_1a0.xp = -NAN;
    local_1a0.yp = -NAN;
    local_1a0.w = -NAN;
    local_1a0.h = -NAN;
    QRectF::QRectF(in_stack_fffffffffffffba0,(QPointF *)in_stack_fffffffffffffb98,
                   (QSizeF *)in_stack_fffffffffffffb90);
    QChar::QChar<char16_t,_true>(&local_1a2,L' ');
    iVar4 = QFontMetrics::horizontalAdvance((QFontMetrics *)in_stack_fffffffffffffbb0,ch);
    local_390 = (qreal)iVar4;
    if (aDirection == LeftToRight) {
      qVar8 = QSizeF::width(&local_d8);
      local_390 = -local_390 - qVar8;
    }
    iVar4 = QFontMetrics::height((QFontMetrics *)in_stack_fffffffffffffba0);
    dVar9 = (double)(iVar4 / 2);
    qVar8 = QSizeF::height(&local_d8);
    QRectF::translate(&local_1a0,local_390,dVar9 - qVar8 / 2.0);
    QPainter::save((QPainter *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
    QPainter::setRenderHint
              ((QPainter *)in_stack_fffffffffffffb90,
               (RenderHint)((ulong)in_stack_fffffffffffffb88 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffb88 >> 0x18,0));
    QTextBlock::blockFormat((QTextBlock *)in_stack_fffffffffffffba0);
    MVar5 = QTextBlockFormat::marker((QTextBlockFormat *)0x8011de);
    bVar1 = MVar5 != NoMarker;
    QTextBlockFormat::~QTextBlockFormat((QTextBlockFormat *)0x8011f8);
    if (in_R9 == (QTextLayout *)0x0) {
      local_1c8 = &DAT_aaaaaaaaaaaaaaaa;
      QTextFormat::foreground((QTextFormat *)in_stack_fffffffffffffb88);
      local_1cc = 0;
      bVar2 = ::operator==((QBrush *)in_stack_fffffffffffffb90,
                           (BrushStyle *)in_stack_fffffffffffffb88);
      if (bVar2) {
        QPalette::text((QPalette *)0x80134c);
        QBrush::operator=((QBrush *)in_stack_fffffffffffffb98,(QBrush *)in_stack_fffffffffffffb90);
      }
      in_stack_fffffffffffffc08 = in_RDX;
      QPen::QPen((QPen *)in_stack_fffffffffffffbb0,(QBrush *)in_stack_fffffffffffffba8,
                 (qreal)in_stack_fffffffffffffba0,
                 (PenStyle)((ulong)in_stack_fffffffffffffb98 >> 0x20),
                 (PenCapStyle)in_stack_fffffffffffffb98,
                 (PenJoinStyle)((ulong)in_stack_fffffffffffffb90 >> 0x20));
      QPainter::setPen((QPainter *)in_stack_fffffffffffffb98,(QPen *)in_stack_fffffffffffffb90);
      QPen::~QPen((QPen *)0x8013b6);
      QBrush::~QBrush((QBrush *)0x8013c3);
    }
    else {
      QTextFormat::foreground((QTextFormat *)in_stack_fffffffffffffb88);
      QPen::QPen((QPen *)in_stack_fffffffffffffbb0,(QBrush *)in_stack_fffffffffffffba8,
                 (qreal)in_stack_fffffffffffffba0,
                 (PenStyle)((ulong)in_stack_fffffffffffffb98 >> 0x20),
                 (PenCapStyle)in_stack_fffffffffffffb98,
                 (PenJoinStyle)((ulong)in_stack_fffffffffffffb90 >> 0x20));
      QPainter::setPen((QPainter *)in_stack_fffffffffffffb98,(QPen *)in_stack_fffffffffffffb90);
      QPen::~QPen((QPen *)0x801286);
      QBrush::~QBrush((QBrush *)0x801293);
      if (!bVar1) {
        QTextFormat::background((QTextFormat *)in_stack_fffffffffffffb88);
        QPainter::fillRect((QPainter *)in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,
                           (QBrush *)in_stack_fffffffffffffb98);
        QBrush::~QBrush((QBrush *)0x8012ec);
      }
    }
    local_1e0 = &DAT_aaaaaaaaaaaaaaaa;
    QPalette::brush((QPalette *)in_stack_fffffffffffffb90,
                    (ColorRole)((ulong)in_stack_fffffffffffffb88 >> 0x20));
    QBrush::QBrush((QBrush *)in_stack_fffffffffffffb90,(QBrush *)in_stack_fffffffffffffb88);
    if (bVar1) {
      iVar4 = QFontMetrics::lineSpacing((QFontMetrics *)in_stack_fffffffffffffba0);
      QRectF::adjust(&local_1a0,(double)-(iVar4 / 6),0.0,(double)-(iVar4 / 6),0.0);
      local_200 = 0xffffffffffffffff;
      local_1f8 = 0xffffffffffffffff;
      local_1f0 = 0xffffffffffffffff;
      local_1e8 = 0xffffffffffffffff;
      QRectF::adjusted(in_stack_fffffffffffffbb0,(qreal)in_stack_fffffffffffffba8,
                       (qreal)in_stack_fffffffffffffba0,(qreal)in_stack_fffffffffffffb98,
                       (qreal)in_stack_fffffffffffffb90);
      if (in_R9 != (QTextLayout *)0x0) {
        QTextFormat::background((QTextFormat *)in_stack_fffffffffffffb88);
        QPainter::fillRect((QPainter *)in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,
                           (QBrush *)in_stack_fffffffffffffb98);
        QBrush::~QBrush((QBrush *)0x801520);
      }
      QTextBlock::blockFormat((QTextBlock *)in_stack_fffffffffffffba0);
      MVar5 = QTextBlockFormat::marker((QTextBlockFormat *)0x801542);
      QTextBlockFormat::~QTextBlockFormat((QTextBlockFormat *)0x801553);
      if (MVar5 == Checked) {
        in_stack_fffffffffffffbc0 = in_RDX;
        QPainter::pen((QPainter *)in_stack_fffffffffffffb90);
        local_228 = QPen::color((QPen *)in_stack_fffffffffffffb98);
        uStack_90 = local_228.ct._4_6_;
        local_98 = local_228._0_6_;
        local_92 = local_228.ct._2_2_;
        in_stack_fffffffffffffbbc = SolidLine;
        QBrush::QBrush((QBrush *)in_stack_fffffffffffffba0,(QColor *)in_stack_fffffffffffffb98,
                       (BrushStyle)((ulong)in_stack_fffffffffffffb90 >> 0x20));
        QPen::QPen((QPen *)in_stack_fffffffffffffbb0,(QBrush *)in_stack_fffffffffffffba8,
                   (qreal)in_stack_fffffffffffffba0,
                   (PenStyle)((ulong)in_stack_fffffffffffffb98 >> 0x20),
                   (PenCapStyle)in_stack_fffffffffffffb98,
                   (PenJoinStyle)((ulong)in_stack_fffffffffffffb90 >> 0x20));
        QPainter::setPen((QPainter *)in_stack_fffffffffffffb98,(QPen *)in_stack_fffffffffffffb90);
        QPen::~QPen((QPen *)0x801614);
        QBrush::~QBrush((QBrush *)0x80161e);
        local_238 = QRectF::topLeft(in_stack_fffffffffffffb98);
        local_248 = QRectF::bottomRight(in_stack_fffffffffffffb98);
        QPainter::drawLine((QPainter *)in_stack_fffffffffffffba8,
                           (QPointF *)in_stack_fffffffffffffba0,(QPointF *)in_stack_fffffffffffffb98
                          );
        local_258 = QRectF::topRight(in_stack_fffffffffffffb98);
        local_268 = QRectF::bottomLeft(in_stack_fffffffffffffb98);
        QPainter::drawLine((QPainter *)in_stack_fffffffffffffba8,
                           (QPointF *)in_stack_fffffffffffffba0,(QPointF *)in_stack_fffffffffffffb98
                          );
        QPainter::pen((QPainter *)in_stack_fffffffffffffb90);
        local_288 = QPen::color((QPen *)in_stack_fffffffffffffb98);
        local_a8 = local_288._0_8_;
        local_a0 = local_288.ct._4_4_;
        local_9c = local_288.ct._8_2_;
        QBrush::QBrush((QBrush *)in_stack_fffffffffffffba0,(QColor *)in_stack_fffffffffffffb98,
                       (BrushStyle)((ulong)in_stack_fffffffffffffb90 >> 0x20));
        QPen::QPen((QPen *)in_stack_fffffffffffffbb0,(QBrush *)in_stack_fffffffffffffba8,
                   (qreal)in_stack_fffffffffffffba0,
                   (PenStyle)((ulong)in_stack_fffffffffffffb98 >> 0x20),
                   (PenCapStyle)in_stack_fffffffffffffb98,
                   (PenJoinStyle)((ulong)in_stack_fffffffffffffb90 >> 0x20));
        QPainter::setPen((QPainter *)in_stack_fffffffffffffb98,(QPen *)in_stack_fffffffffffffb90);
        QPen::~QPen((QPen *)0x80179d);
        QBrush::~QBrush((QBrush *)0x8017aa);
      }
      QPainter::drawRect((QPainter *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
    }
    font_00 = (QFont *)(ulong)(uint)(SVar3 + 8);
    switch(font_00) {
    case (QFont *)0x0:
    case (QFont *)0x1:
    case (QFont *)0x2:
    case (QFont *)0x3:
    case (QFont *)0x4:
      local_290.d = (QTextEngine *)&DAT_aaaaaaaaaaaaaaaa;
      QAbstractTextDocumentLayout::paintDevice
                ((QAbstractTextDocumentLayout *)in_stack_fffffffffffffb90);
      QTextLayout::QTextLayout
                ((QTextLayout *)in_stack_fffffffffffffbc0,
                 (QString *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),font_00,
                 in_stack_fffffffffffffba8);
      QTextLayout::setCacheEnabled(&local_290,true);
      local_2a8 = &DAT_aaaaaaaaaaaaaaaa;
      local_2a0 = -NAN;
      local_298 = (QTextOptionPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      Qt::operator|((enum_type)((ulong)in_stack_fffffffffffffb90 >> 0x20),
                    (enum_type)in_stack_fffffffffffffb90);
      QTextOption::QTextOption
                (in_stack_fffffffffffffb90,
                 (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
                 SUB84((ulong)in_stack_fffffffffffffb98 >> 0x20,0));
      QTextOption::setTextDirection((QTextOption *)&local_2a8,aDirection);
      QTextLayout::setTextOption
                ((QTextLayout *)in_stack_fffffffffffffb90,(QTextOption *)in_stack_fffffffffffffb88);
      included = (undefined1)((ulong)in_stack_fffffffffffffb88 >> 0x38);
      QTextLayout::beginLayout((QTextLayout *)in_stack_fffffffffffffb90);
      local_2b8 = &DAT_aaaaaaaaaaaaaaaa;
      local_2b0 = (QTextEngine *)&DAT_aaaaaaaaaaaaaaaa;
      QVar10 = QTextLayout::createLine((QTextLayout *)in_stack_fffffffffffffbc0);
      local_2b0 = QVar10.eng;
      local_2b8 = (undefined1 *)CONCAT44(local_2b8._4_4_,QVar10.index);
      bVar1 = QTextLine::isValid((QTextLine *)&local_2b8);
      if (bVar1) {
        QTextLine::setLeadingIncluded((QTextLine *)in_stack_fffffffffffffb90,(bool)included);
      }
      QTextLayout::endLayout((QTextLayout *)in_stack_fffffffffffffb98);
      qVar8 = QRectF::left(&local_1a0);
      ypos = QPointF::y(&local_f8);
      QPointF::QPointF(&local_2c8,qVar8,ypos);
      memset(local_2e0,0,0x18);
      QList<QTextLayout::FormatRange>::QList((QList<QTextLayout::FormatRange> *)0x80199a);
      QRectF::QRectF(&local_300);
      QTextLayout::draw(in_R9,(QPainter *)p,pos_00,
                        (QList<QTextLayout::FormatRange> *)CONCAT44(SVar3,in_stack_fffffffffffffc88)
                        ,clip);
      QList<QTextLayout::FormatRange>::~QList((QList<QTextLayout::FormatRange> *)0x8019de);
      QTextOption::~QTextOption(in_stack_fffffffffffffb90);
      QTextLayout::~QTextLayout((QTextLayout *)in_stack_fffffffffffffb90);
      break;
    case (QFont *)0x5:
      if (!bVar1) {
        QPainter::pen((QPainter *)in_stack_fffffffffffffb90);
        QPen::brush((QPen *)in_RDX);
        QPainter::fillRect((QPainter *)in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,in_RDX);
        QBrush::~QBrush((QBrush *)0x801a63);
      }
      break;
    case (QFont *)0x6:
      if (!bVar1) {
        QRectF::translated(in_stack_fffffffffffffba0,(qreal)in_stack_fffffffffffffb98,(qreal)in_RDX)
        ;
        QPainter::drawEllipse((QPainter *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
      }
      break;
    case (QFont *)0x7:
      if (!bVar1) {
        QPainter::pen((QPainter *)in_stack_fffffffffffffb90);
        QPen::brush((QPen *)in_stack_fffffffffffffb98);
        QPainter::setBrush((QPainter *)in_stack_fffffffffffffba8,(QBrush *)in_stack_fffffffffffffba0
                          );
        QBrush::~QBrush((QBrush *)0x801b04);
        QPainter::setPen((QPainter *)in_stack_fffffffffffffb90,in_stack_fffffffffffffbbc);
        QPainter::drawEllipse((QPainter *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
      }
      break;
    case (QFont *)0x8:
    }
    QPainter::restore((QPainter *)in_stack_fffffffffffffc08);
    QBrush::~QBrush((QBrush *)0x801b48);
  }
LAB_00801b53:
  QString::~QString((QString *)0x801b60);
  QTextListFormat::~QTextListFormat((QTextListFormat *)0x801b6d);
  QFontMetrics::~QFontMetrics((QFontMetrics *)0x801b7a);
  QFont::~QFont((QFont *)0x801b87);
  QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x801b94);
  QTextBlockFormat::~QTextBlockFormat((QTextBlockFormat *)0x801ba1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextDocumentLayoutPrivate::drawListItem(const QPointF &offset, QPainter *painter,
                                              const QAbstractTextDocumentLayout::PaintContext &context,
                                              const QTextBlock &bl, const QTextCharFormat *selectionFormat) const
{
    Q_Q(const QTextDocumentLayout);
    const QTextBlockFormat blockFormat = bl.blockFormat();
    const QTextCharFormat charFormat = bl.charFormat();
    QFont font(charFormat.font());
    if (q->paintDevice())
        font = QFont(font, q->paintDevice());

    const QFontMetrics fontMetrics(font);
    QTextObject * const object = document->objectForFormat(blockFormat);
    const QTextListFormat lf = object->format().toListFormat();
    int style = lf.style();
    QString itemText;
    QSizeF size;

    if (blockFormat.hasProperty(QTextFormat::ListStyle))
        style = QTextListFormat::Style(blockFormat.intProperty(QTextFormat::ListStyle));

    QTextLayout *layout = bl.layout();
    if (layout->lineCount() == 0)
        return;
    QTextLine firstLine = layout->lineAt(0);
    Q_ASSERT(firstLine.isValid());
    QPointF pos = (offset + layout->position()).toPoint();
    Qt::LayoutDirection dir = bl.textDirection();
    {
        QRectF textRect = firstLine.naturalTextRect();
        pos += textRect.topLeft().toPoint();
        if (dir == Qt::RightToLeft)
            pos.rx() += textRect.width();
    }

    switch (style) {
    case QTextListFormat::ListDecimal:
    case QTextListFormat::ListLowerAlpha:
    case QTextListFormat::ListUpperAlpha:
    case QTextListFormat::ListLowerRoman:
    case QTextListFormat::ListUpperRoman:
        itemText = static_cast<QTextList *>(object)->itemText(bl);
        size.setWidth(fontMetrics.horizontalAdvance(itemText));
        size.setHeight(fontMetrics.height());
        break;

    case QTextListFormat::ListSquare:
    case QTextListFormat::ListCircle:
    case QTextListFormat::ListDisc:
        size.setWidth(fontMetrics.lineSpacing() / 3);
        size.setHeight(size.width());
        break;

    case QTextListFormat::ListStyleUndefined:
        return;
    default: return;
    }

    QRectF r(pos, size);

    qreal xoff = fontMetrics.horizontalAdvance(u' ');
    if (dir == Qt::LeftToRight)
        xoff = -xoff - size.width();
    r.translate( xoff, (fontMetrics.height() / 2) - (size.height() / 2));

    painter->save();

    painter->setRenderHint(QPainter::Antialiasing);

    const bool marker = bl.blockFormat().marker() != QTextBlockFormat::MarkerType::NoMarker;
    if (selectionFormat) {
        painter->setPen(QPen(selectionFormat->foreground(), 0));
        if (!marker)
            painter->fillRect(r, selectionFormat->background());
    } else {
        QBrush fg = charFormat.foreground();
        if (fg == Qt::NoBrush)
            fg = context.palette.text();
        painter->setPen(QPen(fg, 0));
    }

    QBrush brush = context.palette.brush(QPalette::Text);

    if (marker) {
        int adj = fontMetrics.lineSpacing() / 6;
        r.adjust(-adj, 0, -adj, 0);
        const QRectF outer = r.adjusted(-adj, -adj, adj, adj);
        if (selectionFormat)
            painter->fillRect(outer, selectionFormat->background());
        if (bl.blockFormat().marker() == QTextBlockFormat::MarkerType::Checked) {
            // ### Qt7: render with QStyle / PE_IndicatorCheckBox. We don't currently
            // have access to that here, because it would be a widget dependency.
            painter->setPen(QPen(painter->pen().color(), 2));
            painter->drawLine(r.topLeft(), r.bottomRight());
            painter->drawLine(r.topRight(), r.bottomLeft());
            painter->setPen(QPen(painter->pen().color(), 0));
        }
        painter->drawRect(outer);
    }

    switch (style) {
    case QTextListFormat::ListDecimal:
    case QTextListFormat::ListLowerAlpha:
    case QTextListFormat::ListUpperAlpha:
    case QTextListFormat::ListLowerRoman:
    case QTextListFormat::ListUpperRoman: {
        QTextLayout layout(itemText, font, q->paintDevice());
        layout.setCacheEnabled(true);
        QTextOption option(Qt::AlignLeft | Qt::AlignAbsolute);
        option.setTextDirection(dir);
        layout.setTextOption(option);
        layout.beginLayout();
        QTextLine line = layout.createLine();
        if (line.isValid())
            line.setLeadingIncluded(true);
        layout.endLayout();
        layout.draw(painter, QPointF(r.left(), pos.y()));
        break;
    }
    case QTextListFormat::ListSquare:
        if (!marker)
            painter->fillRect(r, painter->pen().brush());
        break;
    case QTextListFormat::ListCircle:
        if (!marker)
            painter->drawEllipse(r.translated(0.5, 0.5)); // pixel align for sharper rendering
        break;
    case QTextListFormat::ListDisc:
        if (!marker) {
            painter->setBrush(painter->pen().brush());
            painter->setPen(Qt::NoPen);
            painter->drawEllipse(r);
        }
        break;
    case QTextListFormat::ListStyleUndefined:
        break;
    default:
        break;
    }

    painter->restore();
}